

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BLBackTrace.cpp
# Opt level: O0

void __thiscall amrex::BLBTer::BLBTer(BLBTer *this,string *s,char *file,int line)

{
  int iVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int in_ECX;
  char *in_RDX;
  string *in_RSI;
  string *in_RDI;
  ostringstream ss0;
  ostringstream ss;
  value_type *in_stack_fffffffffffffc08;
  string local_3a0 [96];
  ostringstream local_340 [376];
  string local_1c8 [48];
  ostringstream local_198 [380];
  int local_1c;
  char *local_18;
  string *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,"Line ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
  poVar2 = std::operator<<(poVar2,", File ");
  std::operator<<(poVar2,local_18);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=(in_RDI,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::ostringstream(local_340);
  poVar2 = std::operator<<((ostream *)local_340,"Proc. ");
  iVar1 = ParallelDescriptor::MyProc();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  __x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::operator<<(poVar2,": \"");
  this_00 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)std::operator<<((ostream *)__x,local_10);
  std::operator<<((ostream *)this_00,"\"");
  std::__cxx11::ostringstream::str();
  std::make_pair<std::__cxx11::string,std::__cxx11::string&>(__x,&this_00->first);
  std::
  stack<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::push((stack<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *)this_00,in_stack_fffffffffffffc08);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(this_00);
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::ostringstream::~ostringstream(local_340);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

BLBTer::BLBTer(const std::string& s, const char* file, int line)
{
    std::ostringstream ss;
    ss << "Line " << line << ", File " << file;
    line_file = ss.str();

#ifdef AMREX_USE_OMP
    if (omp_in_parallel()) {
        std::ostringstream ss0;
        ss0 << "Proc. " << ParallelDescriptor::MyProc()
            << ", Thread " << omp_get_thread_num()
            << ": \"" << s << "\"";
        BLBackTrace::bt_stack.push(std::make_pair(ss0.str(), line_file));
    }
    else {
        #pragma omp parallel
        {
            std::ostringstream ss0;
            ss0 << "Proc. " << ParallelDescriptor::MyProc()
                << ", Master Thread"
                << ": \"" << s << "\"";
            BLBackTrace::bt_stack.push(std::make_pair(ss0.str(), line_file));
        }
    }
#else
    std::ostringstream ss0;
    ss0 << "Proc. " << ParallelDescriptor::MyProc()
        << ": \"" << s << "\"";
    BLBackTrace::bt_stack.push(std::make_pair(ss0.str(), line_file));
#endif
}